

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcSlabType::IfcSlabType(IfcSlabType *this)

{
  *(undefined ***)&this->field_0x1c0 = &PTR__Object_00814a00;
  *(undefined8 *)&this->field_0x1c8 = 0;
  *(char **)&this->field_0x1d0 = "IfcSlabType";
  IfcBuildingElementType::IfcBuildingElementType
            ((IfcBuildingElementType *)this,&PTR_construction_vtable_24__008a1ad8);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlabType,_1UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x8a19a8;
  *(undefined8 *)&this->field_0x1c0 = 0x8a1ac0;
  *(undefined8 *)&this->field_0x88 = 0x8a19d0;
  *(undefined8 *)&this->field_0x98 = 0x8a19f8;
  *(undefined8 *)&this->field_0xf0 = 0x8a1a20;
  *(undefined8 *)&this->field_0x148 = 0x8a1a48;
  *(undefined8 *)&this->field_0x180 = 0x8a1a70;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlabType,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x8a1a98;
  *(undefined1 **)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlabType,_1UL>).field_0x10
       = &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlabType,_1UL>).field_0x20;
  *(undefined8 *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlabType,_1UL>).field_0x18 =
       0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlabType,_1UL>).field_0x20 = 0;
  return;
}

Assistant:

IfcSlabType() : Object("IfcSlabType") {}